

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::io::anon_unknown_0::TokenizerTest_MultipleTokens_DD_MultipleTokens_Test::TestBody
          (TokenizerTest_MultipleTokens_DD_MultipleTokens_Test *this)

{
  Message *pMVar1;
  Message local_28;
  ScopedTrace local_19;
  uint local_18;
  uint uStack_14;
  ScopedTrace gtest_trace_444;
  int j;
  int i;
  TokenizerTest_MultipleTokens_DD_MultipleTokens_Test *this_local;
  
  for (uStack_14 = 0; uStack_14 < 10; uStack_14 = uStack_14 + 1) {
    for (local_18 = 0; local_18 < 8; local_18 = local_18 + 1) {
      testing::Message::Message(&local_28);
      pMVar1 = testing::Message::operator<<(&local_28,(char (*) [24])"kMultiTokenCases case #");
      pMVar1 = testing::Message::operator<<(pMVar1,(int *)&stack0xffffffffffffffec);
      pMVar1 = testing::Message::operator<<(pMVar1,(char (*) [3])0x20d8522);
      pMVar1 = testing::Message::operator<<
                         (pMVar1,(MultiTokenCase *)
                                 (io::(anonymous_namespace)::kMultiTokenCases +
                                 (long)(int)uStack_14 * 0x38));
      pMVar1 = testing::Message::operator<<(pMVar1,(char (*) [3])0x1fe663c);
      pMVar1 = testing::Message::operator<<(pMVar1,(char (*) [19])"kBlockSizes case #");
      pMVar1 = testing::Message::operator<<(pMVar1,(int *)&local_18);
      pMVar1 = testing::Message::operator<<(pMVar1,(char (*) [3])0x20d8522);
      pMVar1 = testing::Message::operator<<
                         (pMVar1,(int *)(io::(anonymous_namespace)::kBlockSizes +
                                        (long)(int)local_18 * 4));
      testing::ScopedTrace::ScopedTrace<testing::Message>
                (&local_19,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                 ,0x1bc,pMVar1);
      testing::Message::~Message(&local_28);
      io::(anonymous_namespace)::TokenizerTest_MultipleTokens_DD::
      DoSingleCase<google::protobuf::io::(anonymous_namespace)::MultiTokenCase,int>
                ((TokenizerTest_MultipleTokens_DD *)this,
                 (MultiTokenCase *)
                 (io::(anonymous_namespace)::kMultiTokenCases + (long)(int)uStack_14 * 0x38),
                 (int *)(io::(anonymous_namespace)::kBlockSizes + (long)(int)local_18 * 4));
      testing::ScopedTrace::~ScopedTrace(&local_19);
    }
  }
  return;
}

Assistant:

TEST_2D(TokenizerTest, MultipleTokens, kMultiTokenCases, kBlockSizes) {
  // Set up the tokenizer.
  TestInputStream input(kMultiTokenCases_case.input.data(),
                        kMultiTokenCases_case.input.size(), kBlockSizes_case);
  TestErrorCollector error_collector;
  Tokenizer tokenizer(&input, &error_collector);

  // Before Next() is called, the initial token should always be TYPE_START.
  EXPECT_EQ(Tokenizer::TYPE_START, tokenizer.current().type);
  EXPECT_EQ("", tokenizer.current().text);
  EXPECT_EQ(0, tokenizer.current().line);
  EXPECT_EQ(0, tokenizer.current().column);
  EXPECT_EQ(0, tokenizer.current().end_column);

  // Loop through all expected tokens.
  int i = 0;
  Tokenizer::Token token;
  do {
    token = kMultiTokenCases_case.output[i++];

    SCOPED_TRACE(testing::Message() << "Token #" << i << ": " << token.text);

    Tokenizer::Token previous = tokenizer.current();

    // Next() should only return false when it hits the end token.
    if (token.type != Tokenizer::TYPE_END) {
      ASSERT_TRUE(tokenizer.Next());
    } else {
      ASSERT_FALSE(tokenizer.Next());
    }

    // Check that the previous token is set correctly.
    EXPECT_EQ(previous.type, tokenizer.previous().type);
    EXPECT_EQ(previous.text, tokenizer.previous().text);
    EXPECT_EQ(previous.line, tokenizer.previous().line);
    EXPECT_EQ(previous.column, tokenizer.previous().column);
    EXPECT_EQ(previous.end_column, tokenizer.previous().end_column);

    // Check that the token matches the expected one.
    EXPECT_EQ(token.type, tokenizer.current().type);
    EXPECT_EQ(token.text, tokenizer.current().text);
    EXPECT_EQ(token.line, tokenizer.current().line);
    EXPECT_EQ(token.column, tokenizer.current().column);
    EXPECT_EQ(token.end_column, tokenizer.current().end_column);

  } while (token.type != Tokenizer::TYPE_END);

  // There should be no errors.
  EXPECT_TRUE(error_collector.text_.empty());
}